

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.h
# Opt level: O0

ostream * absl::operator<<(ostream *os,crc32c_t crc)

{
  ostream *poVar1;
  uint32_t local_7c;
  FormatSpecTemplate<(absl::FormatConversionCharSet)655355> local_78;
  Streamable local_68;
  ostream *local_18;
  ostream *os_local;
  crc32c_t crc_local;
  
  local_18 = os;
  os_local._4_4_ = crc.crc_;
  str_format_internal::FormatSpecTemplate<(absl::FormatConversionCharSet)655355>::FormatSpecTemplate
            (&local_78,"%08x");
  local_7c = crc32c_t::operator_cast_to_unsigned_int((crc32c_t *)((long)&os_local + 4));
  StreamFormat<unsigned_int>(&local_68,&local_78,&local_7c);
  poVar1 = str_format_internal::operator<<(os,&local_68);
  str_format_internal::Streamable::~Streamable(&local_68);
  return poVar1;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, crc32c_t crc) {
  return os << absl::StreamFormat("%08x", static_cast<uint32_t>(crc));
}